

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_tessellator.cc
# Opt level: O0

S1ChordAngle __thiscall
S2EdgeTessellator::EstimateMaxError
          (S2EdgeTessellator *this,R2Point *pa,S2Point *a,R2Point *pb,S2Point *b)

{
  Projection *pPVar1;
  S1ChordAngle *pSVar2;
  undefined4 uVar3;
  double dVar4;
  undefined4 uVar5;
  S1ChordAngle local_d8;
  S1ChordAngle local_d0;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  undefined1 local_b8 [8];
  S2Point pmid2;
  undefined1 local_90 [8];
  S2Point pmid1;
  S2Point mid2;
  S2Point mid1;
  double t2;
  double t1;
  S2Point *b_local;
  R2Point *pb_local;
  S2Point *a_local;
  R2Point *pa_local;
  S2EdgeTessellator *this_local;
  
  dVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                    ((BasicVector<Vector3,_double,_3UL> *)a,b);
  uVar3 = SUB84(dVar4,0);
  uVar5 = (undefined4)((ulong)dVar4 >> 0x20);
  if (-1e-14 <= dVar4) {
    S2::Interpolate((S2Point *)(mid2.c_ + 2),0.31215691082248315,a,b);
    S2::Interpolate((S2Point *)(pmid1.c_ + 2),0.6878430891775169,a,b);
    pPVar1 = this->proj_;
    (*this->proj_->_vptr_Projection[6])(0x3fd3fa60faccfd31,this->proj_,pa,pb);
    (*pPVar1->_vptr_Projection[3])(local_90,pPVar1,pmid2.c_ + 2);
    pPVar1 = this->proj_;
    (*this->proj_->_vptr_Projection[6])(0x3fe602cf82998168,this->proj_,pa,pb);
    local_c0 = CONCAT44(uVar5,uVar3);
    (*pPVar1->_vptr_Projection[3])(local_b8,pPVar1,local_c8);
    S1ChordAngle::S1ChordAngle(&local_d0,(S2Point *)(mid2.c_ + 2),(S2Point *)local_90);
    S1ChordAngle::S1ChordAngle(&local_d8,(S2Point *)(pmid1.c_ + 2),(S2Point *)local_b8);
    pSVar2 = std::max<S1ChordAngle>(&local_d0,&local_d8);
    this_local = (S2EdgeTessellator *)pSVar2->length2_;
  }
  else {
    this_local = (S2EdgeTessellator *)S1ChordAngle::Infinity();
  }
  return (S1ChordAngle)(double)this_local;
}

Assistant:

S1ChordAngle S2EdgeTessellator::EstimateMaxError(
    const R2Point& pa, const S2Point& a, const R2Point& pb, const S2Point& b)
    const {
  // See the algorithm description at the top of this file.

  // We always tessellate edges longer than 90 degrees on the sphere, since the
  // approximation below is not robust enough to handle such edges.
  if (a.DotProd(b) < -1e-14) return S1ChordAngle::Infinity();

  constexpr double t1 = kInterpolationFraction;
  constexpr double t2 = 1 - kInterpolationFraction;
  S2Point mid1 = S2::Interpolate(t1, a, b);
  S2Point mid2 = S2::Interpolate(t2, a, b);
  S2Point pmid1 = proj_.Unproject(proj_.Interpolate(t1, pa, pb));
  S2Point pmid2 = proj_.Unproject(proj_.Interpolate(t2, pa, pb));
  return std::max(S1ChordAngle(mid1, pmid1), S1ChordAngle(mid2, pmid2));
}